

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

int __thiscall Sphere::init(Sphere *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int iVar2;
  int k;
  int j;
  int i;
  Vector3 *B;
  Vector3 *this_00;
  Vector3 *in_stack_ffffffffffffffa8;
  BoundingBox *in_stack_ffffffffffffffb0;
  Vector3 local_48;
  Vector3 local_30;
  int local_14;
  int local_10;
  int local_c;
  Sphere *local_8;
  
  local_8 = this;
  for (local_c = -1; local_c < 2; local_c = local_c + 2) {
    for (local_10 = -1; local_10 < 2; local_10 = local_10 + 2) {
      for (local_14 = -1; local_14 < 2; local_14 = local_14 + 2) {
        B = &this->center;
        dVar1 = this->r;
        this_00 = &local_48;
        Vector3::Vector3(this_00,(double)local_c * dVar1,(double)local_10 * dVar1,
                         (double)local_14 * dVar1);
        operator+(this_00,B);
        ctx = (EVP_PKEY_CTX *)&local_30;
        BoundingBox::include(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        Vector3::~Vector3(&local_30);
        Vector3::~Vector3(&local_48);
      }
    }
  }
  iVar2 = Primitive::init(&this->super_Primitive,ctx);
  return iVar2;
}

Assistant:

void Sphere::init()
{
    for (int i = -1; i < 2; i += 2)
        for (int j = -1; j < 2; j += 2)
            for (int k = -1; k < 2; k += 2)
                bbox.include(center + Vector3(i * r, j * r, k * r));
    Primitive::init();
}